

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

size_t trailers_read(char *buffer,size_t size,size_t nitems,void *raw)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  ulong __n;
  
  sVar1 = Curl_dyn_len((dynbuf *)((long)raw + 0x1210));
  uVar2 = sVar1 - *(long *)((long)raw + 0x1208);
  __n = size * nitems;
  if (uVar2 <= size * nitems) {
    __n = uVar2;
  }
  if (__n != 0) {
    pcVar3 = Curl_dyn_ptr((dynbuf *)((long)raw + 0x1210));
    memcpy(buffer,pcVar3 + *(long *)((long)raw + 0x1208),__n);
    *(long *)((long)raw + 0x1208) = *(long *)((long)raw + 0x1208) + __n;
  }
  return __n;
}

Assistant:

static size_t trailers_read(char *buffer, size_t size, size_t nitems,
                            void *raw)
{
  struct Curl_easy *data = (struct Curl_easy *)raw;
  struct dynbuf *trailers_buf = &data->state.trailers_buf;
  size_t bytes_left = Curl_dyn_len(trailers_buf) -
    data->state.trailers_bytes_sent;
  size_t to_copy = (size*nitems < bytes_left) ? size*nitems : bytes_left;
  if(to_copy) {
    memcpy(buffer,
           Curl_dyn_ptr(trailers_buf) + data->state.trailers_bytes_sent,
           to_copy);
    data->state.trailers_bytes_sent += to_copy;
  }
  return to_copy;
}